

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccopy_to_ucol.c
# Opt level: O1

int ccopy_to_ucol(int jcol,int nseg,int *segrep,int *repfnz,int *perm_r,singlecomplex *dense,
                 GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int_t iVar3;
  int_t next;
  uint uVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  int_t *piVar8;
  int iVar9;
  int *piVar10;
  int_t nzumax;
  int local_c4;
  int local_c0;
  uint local_bc;
  ulong local_b8;
  ulong local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int_t *local_98;
  int *local_90;
  int *local_88;
  int *local_80;
  int *local_78;
  int_t *local_70;
  int_t *local_68;
  ulong local_60;
  void *local_58;
  int *local_50;
  long local_48;
  int_t *local_40;
  ulong local_38;
  
  piVar7 = Glu->xsup;
  piVar10 = Glu->supno;
  local_68 = Glu->lsub;
  piVar8 = Glu->xlsub;
  local_58 = Glu->ucol;
  local_70 = Glu->usub;
  local_40 = Glu->xusub;
  local_c4 = Glu->nzumax;
  local_48 = (long)jcol;
  local_b0 = (ulong)(uint)local_40[local_48];
  if (0 < nseg) {
    iVar5 = piVar10[local_48];
    local_60 = (ulong)(uint)nseg;
    local_b8 = 0;
    local_c0 = iVar5;
    local_bc = nseg;
    local_a0 = jcol;
    local_98 = piVar8;
    local_90 = piVar10;
    local_88 = piVar7;
    local_80 = segrep;
    local_78 = repfnz;
    local_50 = perm_r;
    do {
      iVar1 = segrep[local_60 - 1];
      if ((piVar10[iVar1] != iVar5) && (local_a4 = repfnz[iVar1], local_a4 != -1)) {
        local_a8 = (local_a4 - piVar7[piVar10[iVar1]]) + piVar8[piVar7[piVar10[iVar1]]];
        local_38 = (ulong)(uint)(iVar1 - local_a4);
        local_9c = (iVar1 - local_a4) + (int)local_b0 + 1;
        if (local_c4 < local_9c) {
          do {
            iVar5 = local_a0;
            next = (int_t)local_b0;
            iVar3 = cLUMemXpand(local_a0,next,UCOL,&local_c4,Glu);
            if (iVar3 != 0) {
              return iVar3;
            }
            local_58 = Glu->ucol;
            iVar3 = cLUMemXpand(iVar5,next,USUB,&local_c4,Glu);
            if (iVar3 != 0) {
              return iVar3;
            }
          } while (local_c4 < local_9c);
          local_68 = Glu->lsub;
          local_70 = Glu->usub;
        }
        repfnz = local_78;
        segrep = local_80;
        piVar7 = local_88;
        piVar8 = local_98;
        piVar10 = local_90;
        iVar5 = local_c0;
        nseg = local_bc;
        if (-1 < (int)local_38) {
          iVar9 = (int)local_b0;
          lVar6 = 0;
          do {
            iVar2 = local_68[local_a8 + lVar6];
            local_70[iVar9 + lVar6] = local_50[iVar2];
            *(singlecomplex *)((long)local_58 + lVar6 * 8 + (long)iVar9 * 8) = dense[iVar2];
            dense[iVar2].r = 0.0;
            dense[iVar2].i = 0.0;
            lVar6 = lVar6 + 1;
          } while ((iVar1 - local_a4) + 1 != (int)lVar6);
          local_b0 = (ulong)(uint)(iVar9 + (int)lVar6);
        }
      }
      local_60 = local_60 - 1;
      uVar4 = (int)local_b8 + 1;
      local_b8 = (ulong)uVar4;
    } while (uVar4 != nseg);
  }
  local_40[local_48 + 1] = (int_t)local_b0;
  return 0;
}

Assistant:

int
ccopy_to_ucol(
	      int        jcol,	  /* in */
	      int        nseg,	  /* in */
	      int        *segrep,  /* in */
	      int        *repfnz,  /* in */
	      int        *perm_r,  /* in */
	      singlecomplex     *dense,   /* modified - reset to zero on return */
	      GlobalLU_t *Glu      /* modified */
	      )
{
/* 
 * Gather from SPA dense[*] to global ucol[*].
 */
    int ksub, krep, ksupno;
    int i, k, kfnz, segsze;
    int fsupc, irow, jsupno;
    int_t isub, nextu, new_next, mem_error;
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    singlecomplex    *ucol;
    int_t     *usub, *xusub;
    int_t       nzumax;
    singlecomplex zero = {0.0, 0.0};

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    ucol    = (singlecomplex *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    nzumax  = Glu->nzumax;
    
    jsupno = supno[jcol];
    nextu  = xusub[jcol];
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {
	krep = segrep[k--];
	ksupno = supno[krep];

	if ( ksupno != jsupno ) { /* Should go into ucol[] */
	    kfnz = repfnz[krep];
	    if ( kfnz != SLU_EMPTY ) {	/* Nonzero U-segment */

	    	fsupc = xsup[ksupno];
	        isub = xlsub[fsupc] + kfnz - fsupc;
	        segsze = krep - kfnz + 1;

		new_next = nextu + segsze;
		while ( new_next > nzumax ) {
		    mem_error = cLUMemXpand(jcol, nextu, UCOL, &nzumax, Glu);
		    if (mem_error) return (mem_error);
		    ucol = (singlecomplex *) Glu->ucol;
		    mem_error = cLUMemXpand(jcol, nextu, USUB, &nzumax, Glu);
		    if (mem_error) return (mem_error);
		    usub = Glu->usub;
		    lsub = Glu->lsub;
		}
		
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    usub[nextu] = perm_r[irow];
		    ucol[nextu] = dense[irow];
		    dense[irow] = zero;
		    nextu++;
		    isub++;
		} 

	    }

	}

    } /* for each segment... */

    xusub[jcol + 1] = nextu;      /* Close U[*,jcol] */
    return 0;
}